

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::OutputOptionParser::parseIntoConfig
          (OutputOptionParser *this,Command *cmd,ConfigData *config)

{
  char cVar1;
  string *this_00;
  char *local_60 [4];
  string local_40 [32];
  
  std::__cxx11::string::string
            ((string *)local_60,
             (string *)
             (cmd->m_args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cVar1 = *local_60[0];
  std::__cxx11::string::~string((string *)local_60);
  if (cVar1 == '%') {
    std::__cxx11::string::string
              (local_40,(string *)
                        (cmd->m_args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_40);
    std::__cxx11::string::operator=((string *)&config->stream,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    this_00 = local_40;
  }
  else {
    this_00 = (string *)local_60;
    std::__cxx11::string::string
              (this_00,(string *)
                       (cmd->m_args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::operator=((string *)&config->outputFilename,this_00);
  }
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                if( cmd[0][0] == '%' )
                    config.stream = cmd[0].substr( 1 );
                else
                    config.outputFilename = cmd[0];
            }